

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

QHostInfo QHostInfoAgent::reverseLookup(QHostAddress *address)

{
  byte bVar1;
  NetworkLayerProtocol NVar2;
  quint32 __hostlong;
  uint32_t uVar3;
  int iVar4;
  QHostInfoPrivate *in_RDI;
  long in_FS_OFFSET;
  Q_IPV6ADDR QVar5;
  socklen_t saSize;
  sockaddr *sa;
  QHostInfo *results;
  char hbuf [1025];
  sockaddr_in6 sa6;
  sockaddr_in sa4;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  QList<QHostAddress> *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  QHostInfoPrivate *this;
  undefined4 in_stack_fffffffffffffb20;
  socklen_t __salen;
  sockaddr *local_4d8;
  undefined1 local_4b8 [88];
  undefined1 local_460 [24];
  char local_448 [1028];
  undefined1 local_44 [16];
  sockaddr local_34;
  undefined8 local_24;
  undefined4 local_1c;
  sockaddr local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QHostInfo::QHostInfo((QHostInfo *)in_RDI,in_stack_fffffffffffffb0c);
  local_18.sa_family = 0xaaaa;
  local_18.sa_data[0] = -0x56;
  local_18.sa_data[1] = -0x56;
  local_18.sa_data[2] = -0x56;
  local_18.sa_data[3] = -0x56;
  local_18.sa_data[4] = -0x56;
  local_18.sa_data[5] = -0x56;
  local_18.sa_data[6] = -0x56;
  local_18.sa_data[7] = -0x56;
  local_18.sa_data[8] = -0x56;
  local_18.sa_data[9] = -0x56;
  local_18.sa_data[10] = -0x56;
  local_18.sa_data[0xb] = -0x56;
  local_18.sa_data[0xc] = -0x56;
  local_18.sa_data[0xd] = -0x56;
  local_34.sa_family = 0xaaaa;
  local_34.sa_data[0] = -0x56;
  local_34.sa_data[1] = -0x56;
  local_34.sa_data[2] = -0x56;
  local_34.sa_data[3] = -0x56;
  local_34.sa_data[4] = -0x56;
  local_34.sa_data[5] = -0x56;
  local_34.sa_data[6] = -0x56;
  local_34.sa_data[7] = -0x56;
  local_34.sa_data[8] = -0x56;
  local_34.sa_data[9] = -0x56;
  local_34.sa_data[10] = -0x56;
  local_34.sa_data[0xb] = -0x56;
  local_34.sa_data[0xc] = -0x56;
  local_34.sa_data[0xd] = -0x56;
  local_24 = 0xaaaaaaaaaaaaaaaa;
  local_1c = 0xaaaaaaaa;
  NVar2 = QHostAddress::protocol((QHostAddress *)0x21cb4f);
  if (NVar2 == IPv4Protocol) {
    local_4d8 = &local_18;
    __salen = 0x10;
    memset(&local_18,0,0x10);
    local_18.sa_family = 2;
    __hostlong = QHostAddress::toIPv4Address
                           ((QHostAddress *)CONCAT44(__salen,in_stack_fffffffffffffb20),(bool *)this
                           );
    uVar3 = htonl(__hostlong);
    local_18.sa_data._2_4_ = uVar3;
  }
  else {
    local_4d8 = &local_34;
    __salen = 0x1c;
    memset(&local_34,0,0x1c);
    local_34.sa_family = 10;
    QVar5 = QHostAddress::toIPv6Address
                      ((QHostAddress *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08)
                      );
    local_44._0_8_ = QVar5.c._0_8_;
    local_34.sa_data[6] = local_44[0];
    local_34.sa_data[7] = local_44[1];
    local_34.sa_data[8] = local_44[2];
    local_34.sa_data[9] = local_44[3];
    local_34.sa_data[10] = local_44[4];
    local_34.sa_data[0xb] = local_44[5];
    local_34.sa_data[0xc] = local_44[6];
    local_34.sa_data[0xd] = local_44[7];
    local_44._8_8_ = QVar5.c._8_8_;
    local_24 = local_44._8_8_;
    local_44 = (undefined1  [16])QVar5;
  }
  memset(local_448,0xaa,0x401);
  if (local_4d8 != (sockaddr *)0x0) {
    in_stack_fffffffffffffaf8 = 0;
    iVar4 = getnameinfo(local_4d8,__salen,local_448,0x401,(char *)0x0,0,0);
    if (iVar4 == 0) {
      QByteArrayView::QByteArrayView<1025ul>
                ((QByteArrayView *)in_RDI,
                 (char (*) [1025])CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      QString::fromLatin1((QByteArrayView *)local_460);
      QHostInfo::setHostName
                ((QHostInfo *)in_stack_fffffffffffffb00,
                 (QString *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      QString::~QString((QString *)0x21ccb5);
    }
  }
  QHostInfo::hostName((QHostInfo *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  bVar1 = QString::isEmpty((QString *)0x21ccd4);
  QString::~QString((QString *)0x21cce5);
  if ((bVar1 & 1) != 0) {
    QHostAddress::toString((QHostAddress *)this);
    QHostInfo::setHostName
              ((QHostInfo *)in_stack_fffffffffffffb00,
               (QString *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    QString::~QString((QString *)0x21cd17);
  }
  memset(local_4b8,0,0x18);
  QList<QHostAddress>::QList((QList<QHostAddress> *)0x21cd32);
  QList<QHostAddress>::operator<<
            (in_stack_fffffffffffffb00,
             (parameter_type)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  QHostInfo::setAddresses
            ((QHostInfo *)in_stack_fffffffffffffb00,
             (QList<QHostAddress> *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  QList<QHostAddress>::~QList((QList<QHostAddress> *)0x21cd58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QHostInfo)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::reverseLookup(const QHostAddress &address)
{
    QHostInfo results;
    // Reverse lookup
    sockaddr_in sa4;
    sockaddr_in6 sa6;
    sockaddr *sa = nullptr;
    QT_SOCKLEN_T saSize;
    if (address.protocol() == QAbstractSocket::IPv4Protocol) {
        sa = reinterpret_cast<sockaddr *>(&sa4);
        saSize = sizeof(sa4);
        memset(&sa4, 0, sizeof(sa4));
        sa4.sin_family = AF_INET;
        sa4.sin_addr.s_addr = htonl(address.toIPv4Address());
    } else {
        sa = reinterpret_cast<sockaddr *>(&sa6);
        saSize = sizeof(sa6);
        memset(&sa6, 0, sizeof(sa6));
        sa6.sin6_family = AF_INET6;
        memcpy(&sa6.sin6_addr, address.toIPv6Address().c, sizeof(sa6.sin6_addr));
    }

    char hbuf[NI_MAXHOST];
    if (sa && getnameinfo(sa, saSize, hbuf, sizeof(hbuf), nullptr, 0, 0) == 0)
        results.setHostName(QString::fromLatin1(hbuf));

    if (results.hostName().isEmpty())
        results.setHostName(address.toString());
    results.setAddresses(QList<QHostAddress>() << address);

    return results;
}